

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_tonumber(lua_State *L)

{
  lua_State *L_00;
  int iVar1;
  lua_Integer lVar2;
  ulong uVar3;
  ushort **ppuVar4;
  lua_Number n_00;
  undefined1 auVar5 [16];
  unsigned_long n;
  char *s2;
  char *s1;
  lua_State *plStack_18;
  int base;
  lua_State *L_local;
  
  plStack_18 = L;
  lVar2 = luaL_optinteger(L,2,10);
  s1._4_4_ = (int)lVar2;
  if (s1._4_4_ == 10) {
    luaL_checkany(plStack_18,1);
    iVar1 = lua_isnumber(plStack_18,1);
    L_00 = plStack_18;
    if (iVar1 != 0) {
      n_00 = lua_tonumber(plStack_18,1);
      lua_pushnumber(L_00,n_00);
      return 1;
    }
  }
  else {
    s2 = luaL_checklstring(plStack_18,1,(size_t *)0x0);
    if ((s1._4_4_ < 2) || (0x24 < s1._4_4_)) {
      luaL_argerror(plStack_18,2,"base out of range");
    }
    uVar3 = strtoul(s2,(char **)&n,s1._4_4_);
    if (s2 != (char *)n) {
      while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)*(byte *)n] & 0x2000) != 0) {
        n = n + 1;
      }
      if (*(char *)n == '\0') {
        auVar5._8_4_ = (int)(uVar3 >> 0x20);
        auVar5._0_8_ = uVar3;
        auVar5._12_4_ = 0x45300000;
        lua_pushnumber(plStack_18,
                       (auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
        return 1;
      }
    }
  }
  lua_pushnil(plStack_18);
  return 1;
}

Assistant:

static int luaB_tonumber(lua_State*L){
int base=luaL_optint(L,2,10);
if(base==10){
luaL_checkany(L,1);
if(lua_isnumber(L,1)){
lua_pushnumber(L,lua_tonumber(L,1));
return 1;
}
}
else{
const char*s1=luaL_checkstring(L,1);
char*s2;
unsigned long n;
luaL_argcheck(L,2<=base&&base<=36,2,"base out of range");
n=strtoul(s1,&s2,base);
if(s1!=s2){
while(isspace((unsigned char)(*s2)))s2++;
if(*s2=='\0'){
lua_pushnumber(L,(lua_Number)n);
return 1;
}
}
}
lua_pushnil(L);
return 1;
}